

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O0

void __thiscall wasm::SIMDShuffle::finalize(SIMDShuffle *this)

{
  bool bVar1;
  bool local_39;
  Type local_28;
  BasicType local_20 [2];
  Type local_18;
  SIMDShuffle *local_10;
  SIMDShuffle *this_local;
  
  bVar1 = false;
  if (this->left != (Expression *)0x0) {
    bVar1 = this->right != (Expression *)0x0;
  }
  local_10 = this;
  if (bVar1) {
    wasm::Type::Type(&local_18,v128);
    (this->super_SpecificExpression<(wasm::Expression::Id)31>).super_Expression.type.id =
         local_18.id;
    local_20[1] = 1;
    bVar1 = wasm::Type::operator==(&this->left->type,local_20 + 1);
    local_39 = true;
    if (!bVar1) {
      local_20[0] = unreachable;
      local_39 = wasm::Type::operator==(&this->right->type,local_20);
    }
    if (local_39 != false) {
      wasm::Type::Type(&local_28,unreachable);
      (this->super_SpecificExpression<(wasm::Expression::Id)31>).super_Expression.type.id =
           local_28.id;
    }
    return;
  }
  __assert_fail("left && right",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm.cpp"
                ,0x19a,"void wasm::SIMDShuffle::finalize()");
}

Assistant:

void SIMDShuffle::finalize() {
  assert(left && right);
  type = Type::v128;
  if (left->type == Type::unreachable || right->type == Type::unreachable) {
    type = Type::unreachable;
  }
}